

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O2

void __thiscall ScapeGoatTree::caseC(ScapeGoatTree *this,Node *par,Node *loc)

{
  Node *loc_00;
  Node *pNVar1;
  Node *par_00;
  
  pNVar1 = loc->rightChild;
  loc_00 = loc;
  do {
    par_00 = loc_00;
    loc_00 = pNVar1;
    pNVar1 = loc_00->leftChild;
  } while (loc_00->leftChild != (Node *)0x0);
  if (loc_00->rightChild == (Node *)0x0) {
    pNVar1 = (Node *)&par_00->leftChild;
    if (par_00->leftChild != loc_00) {
      pNVar1 = par_00;
    }
    pNVar1->rightChild = (Node *)0x0;
  }
  else {
    caseB(this,par_00,loc_00);
  }
  if ((par != (Node *)0x0) && (this = (ScapeGoatTree *)&par->leftChild, par->leftChild != loc)) {
    this = (ScapeGoatTree *)par;
  }
  ((Node *)this)->rightChild = loc_00;
  pNVar1 = loc->leftChild;
  loc_00->rightChild = loc->rightChild;
  loc_00->leftChild = pNVar1;
  return;
}

Assistant:

void ScapeGoatTree::caseC(Node *par, Node *loc) {
    Node *ptr, *ptrSave, *suc, *parSuc;
    ptrSave = loc;
    ptr = loc->rightChild;
    while (ptr->leftChild != nullptr) {
        ptrSave = ptr;
        ptr = ptr->leftChild;
    }
    suc = ptr;
    parSuc = ptrSave;
    if (suc->leftChild == nullptr && suc->rightChild == nullptr) {
        caseA(parSuc, suc);
    } else {
        caseB(parSuc, suc);
    }
    if (par == nullptr) {
        root = suc;
    } else {
        if (loc == par->leftChild) {
            par->leftChild = suc;
        } else {
            par->rightChild = suc;
        }
    }
    suc->leftChild = loc->leftChild;
    suc->rightChild = loc->rightChild;
}